

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void PackAndStore4444_SSE2(__m128i *R,__m128i *G,__m128i *B,__m128i *A,uint8_t *dst)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  ulong *in_R8;
  ulong uVar9;
  ulong uVar10;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  ushort local_d8;
  ushort uStack_d6;
  ushort uStack_d4;
  ushort uStack_d2;
  ushort uStack_d0;
  ushort uStack_ce;
  ushort uStack_cc;
  ushort uStack_ca;
  __m128i rgba4444;
  __m128i ga2;
  __m128i rb2;
  __m128i ga1;
  __m128i rb1;
  __m128i mask_0xf0;
  __m128i ba0;
  __m128i rg0;
  
  uVar1 = *in_RDI;
  uVar2 = in_RDI[1];
  uVar3 = *in_RSI;
  uVar4 = in_RSI[1];
  local_118 = (short)uVar1;
  sStack_116 = (short)((ulong)uVar1 >> 0x10);
  sStack_114 = (short)((ulong)uVar1 >> 0x20);
  sStack_112 = (short)((ulong)uVar1 >> 0x30);
  sStack_110 = (short)uVar2;
  sStack_10e = (short)((ulong)uVar2 >> 0x10);
  sStack_10c = (short)((ulong)uVar2 >> 0x20);
  sStack_10a = (short)((ulong)uVar2 >> 0x30);
  local_128 = (short)uVar3;
  sStack_126 = (short)((ulong)uVar3 >> 0x10);
  sStack_124 = (short)((ulong)uVar3 >> 0x20);
  sStack_122 = (short)((ulong)uVar3 >> 0x30);
  sStack_120 = (short)uVar4;
  sStack_11e = (short)((ulong)uVar4 >> 0x10);
  sStack_11c = (short)((ulong)uVar4 >> 0x20);
  sStack_11a = (short)((ulong)uVar4 >> 0x30);
  uVar5 = *in_RDX;
  uVar6 = in_RDX[1];
  uVar7 = *in_RCX;
  uVar8 = in_RCX[1];
  local_138 = (short)uVar5;
  sStack_136 = (short)((ulong)uVar5 >> 0x10);
  sStack_134 = (short)((ulong)uVar5 >> 0x20);
  sStack_132 = (short)((ulong)uVar5 >> 0x30);
  sStack_130 = (short)uVar6;
  sStack_12e = (short)((ulong)uVar6 >> 0x10);
  sStack_12c = (short)((ulong)uVar6 >> 0x20);
  sStack_12a = (short)((ulong)uVar6 >> 0x30);
  local_148 = (short)uVar7;
  sStack_146 = (short)((ulong)uVar7 >> 0x10);
  sStack_144 = (short)((ulong)uVar7 >> 0x20);
  sStack_142 = (short)((ulong)uVar7 >> 0x30);
  sStack_140 = (short)uVar8;
  sStack_13e = (short)((ulong)uVar8 >> 0x10);
  sStack_13c = (short)((ulong)uVar8 >> 0x20);
  sStack_13a = (short)((ulong)uVar8 >> 0x30);
  uVar9 = CONCAT17((0 < sStack_142) * (sStack_142 < 0x100) * (char)((ulong)uVar7 >> 0x30) -
                   (0xff < sStack_142),
                   CONCAT16((0 < sStack_122) * (sStack_122 < 0x100) * (char)((ulong)uVar3 >> 0x30) -
                            (0xff < sStack_122),
                            CONCAT15((0 < sStack_144) * (sStack_144 < 0x100) *
                                     (char)((ulong)uVar7 >> 0x20) - (0xff < sStack_144),
                                     CONCAT14((0 < sStack_124) * (sStack_124 < 0x100) *
                                              (char)((ulong)uVar3 >> 0x20) - (0xff < sStack_124),
                                              CONCAT13((0 < sStack_146) * (sStack_146 < 0x100) *
                                                       (char)((ulong)uVar7 >> 0x10) -
                                                       (0xff < sStack_146),
                                                       CONCAT12((0 < sStack_126) *
                                                                (sStack_126 < 0x100) *
                                                                (char)((ulong)uVar3 >> 0x10) -
                                                                (0xff < sStack_126),
                                                                CONCAT11((0 < local_148) *
                                                                         (local_148 < 0x100) *
                                                                         (char)uVar7 -
                                                                         (0xff < local_148),
                                                                         (0 < local_128) *
                                                                         (local_128 < 0x100) *
                                                                         (char)uVar3 -
                                                                         (0xff < local_128)))))))) &
          0xf0f0f0f0f0f0f0f0;
  uVar10 = CONCAT17((0 < sStack_13a) * (sStack_13a < 0x100) * (char)((ulong)uVar8 >> 0x30) -
                    (0xff < sStack_13a),
                    CONCAT16((0 < sStack_11a) * (sStack_11a < 0x100) * (char)((ulong)uVar4 >> 0x30)
                             - (0xff < sStack_11a),
                             CONCAT15((0 < sStack_13c) * (sStack_13c < 0x100) *
                                      (char)((ulong)uVar8 >> 0x20) - (0xff < sStack_13c),
                                      CONCAT14((0 < sStack_11c) * (sStack_11c < 0x100) *
                                               (char)((ulong)uVar4 >> 0x20) - (0xff < sStack_11c),
                                               CONCAT13((0 < sStack_13e) * (sStack_13e < 0x100) *
                                                        (char)((ulong)uVar8 >> 0x10) -
                                                        (0xff < sStack_13e),
                                                        CONCAT12((0 < sStack_11e) *
                                                                 (sStack_11e < 0x100) *
                                                                 (char)((ulong)uVar4 >> 0x10) -
                                                                 (0xff < sStack_11e),
                                                                 CONCAT11((0 < sStack_140) *
                                                                          (sStack_140 < 0x100) *
                                                                          (char)uVar8 -
                                                                          (0xff < sStack_140),
                                                                          (0 < sStack_120) *
                                                                          (sStack_120 < 0x100) *
                                                                          (char)uVar4 -
                                                                          (0xff < sStack_120))))))))
           & 0xf0f0f0f0f0f0f0f0;
  local_d8 = (ushort)uVar9;
  uStack_d6 = (ushort)(uVar9 >> 0x10);
  uStack_d4 = (ushort)(uVar9 >> 0x20);
  uStack_d0 = (ushort)uVar10;
  uStack_ce = (ushort)(uVar10 >> 0x10);
  uStack_cc = (ushort)(uVar10 >> 0x20);
  *in_R8 = CONCAT17((0 < sStack_132) * (sStack_132 < 0x100) * (char)((ulong)uVar5 >> 0x30) -
                    (0xff < sStack_132),
                    CONCAT16((0 < sStack_112) * (sStack_112 < 0x100) * (char)((ulong)uVar1 >> 0x30)
                             - (0xff < sStack_112),
                             CONCAT15((0 < sStack_134) * (sStack_134 < 0x100) *
                                      (char)((ulong)uVar5 >> 0x20) - (0xff < sStack_134),
                                      CONCAT14((0 < sStack_114) * (sStack_114 < 0x100) *
                                               (char)((ulong)uVar1 >> 0x20) - (0xff < sStack_114),
                                               CONCAT13((0 < sStack_136) * (sStack_136 < 0x100) *
                                                        (char)((ulong)uVar5 >> 0x10) -
                                                        (0xff < sStack_136),
                                                        CONCAT12((0 < sStack_116) *
                                                                 (sStack_116 < 0x100) *
                                                                 (char)((ulong)uVar1 >> 0x10) -
                                                                 (0xff < sStack_116),
                                                                 CONCAT11((0 < local_138) *
                                                                          (local_138 < 0x100) *
                                                                          (char)uVar5 -
                                                                          (0xff < local_138),
                                                                          (0 < local_118) *
                                                                          (local_118 < 0x100) *
                                                                          (char)uVar1 -
                                                                          (0xff < local_118))))))))
           & 0xf0f0f0f0f0f0f0f0 |
           CONCAT26((ushort)(uVar9 >> 0x34),
                    CONCAT24(uStack_d4 >> 4,CONCAT22(uStack_d6 >> 4,local_d8 >> 4)));
  in_R8[1] = CONCAT17((0 < sStack_12a) * (sStack_12a < 0x100) * (char)((ulong)uVar6 >> 0x30) -
                      (0xff < sStack_12a),
                      CONCAT16((0 < sStack_10a) * (sStack_10a < 0x100) *
                               (char)((ulong)uVar2 >> 0x30) - (0xff < sStack_10a),
                               CONCAT15((0 < sStack_12c) * (sStack_12c < 0x100) *
                                        (char)((ulong)uVar6 >> 0x20) - (0xff < sStack_12c),
                                        CONCAT14((0 < sStack_10c) * (sStack_10c < 0x100) *
                                                 (char)((ulong)uVar2 >> 0x20) - (0xff < sStack_10c),
                                                 CONCAT13((0 < sStack_12e) * (sStack_12e < 0x100) *
                                                          (char)((ulong)uVar6 >> 0x10) -
                                                          (0xff < sStack_12e),
                                                          CONCAT12((0 < sStack_10e) *
                                                                   (sStack_10e < 0x100) *
                                                                   (char)((ulong)uVar2 >> 0x10) -
                                                                   (0xff < sStack_10e),
                                                                   CONCAT11((0 < sStack_130) *
                                                                            (sStack_130 < 0x100) *
                                                                            (char)uVar6 -
                                                                            (0xff < sStack_130),
                                                                            (0 < sStack_110) *
                                                                            (sStack_110 < 0x100) *
                                                                            (char)uVar2 -
                                                                            (0xff < sStack_110))))))
                              )) & 0xf0f0f0f0f0f0f0f0 |
             CONCAT26((ushort)(uVar10 >> 0x34),
                      CONCAT24(uStack_cc >> 4,CONCAT22(uStack_ce >> 4,uStack_d0 >> 4)));
  return;
}

Assistant:

static WEBP_INLINE void PackAndStore4444_SSE2(const __m128i* const R,
                                              const __m128i* const G,
                                              const __m128i* const B,
                                              const __m128i* const A,
                                              uint8_t* const dst) {
#if (WEBP_SWAP_16BIT_CSP == 0)
  const __m128i rg0 = _mm_packus_epi16(*R, *G);
  const __m128i ba0 = _mm_packus_epi16(*B, *A);
#else
  const __m128i rg0 = _mm_packus_epi16(*B, *A);
  const __m128i ba0 = _mm_packus_epi16(*R, *G);
#endif
  const __m128i mask_0xf0 = _mm_set1_epi8(0xf0);
  const __m128i rb1 = _mm_unpacklo_epi8(rg0, ba0);  // rbrbrbrbrb...
  const __m128i ga1 = _mm_unpackhi_epi8(rg0, ba0);  // gagagagaga...
  const __m128i rb2 = _mm_and_si128(rb1, mask_0xf0);
  const __m128i ga2 = _mm_srli_epi16(_mm_and_si128(ga1, mask_0xf0), 4);
  const __m128i rgba4444 = _mm_or_si128(rb2, ga2);
  _mm_storeu_si128((__m128i*)dst, rgba4444);
}